

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMvIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  Scene *pSVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  byte bVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar29;
  undefined1 (*pauVar30) [16];
  long lVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  undefined1 (*pauVar39) [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  float fVar65;
  undefined1 auVar66 [32];
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 auVar67 [64];
  uint uVar72;
  uint uVar73;
  undefined1 auVar71 [64];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined4 uVar84;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  RTCFilterFunctionNArguments local_28f0;
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  RTCHitN local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined4 local_2440;
  undefined4 uStack_243c;
  undefined4 uStack_2438;
  undefined4 uStack_2434;
  undefined4 uStack_2430;
  undefined4 uStack_242c;
  undefined4 uStack_2428;
  undefined4 uStack_2424;
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  uint local_23e0;
  uint uStack_23dc;
  uint uStack_23d8;
  uint uStack_23d4;
  uint uStack_23d0;
  uint uStack_23cc;
  uint uStack_23c8;
  uint uStack_23c4;
  uint local_23c0;
  uint uStack_23bc;
  uint uStack_23b8;
  uint uStack_23b4;
  uint uStack_23b0;
  uint uStack_23ac;
  uint uStack_23a8;
  uint uStack_23a4;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  ulong uVar28;
  undefined1 auVar53 [32];
  undefined1 auVar57 [32];
  
  pauVar39 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar89 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416(fVar1,CONCAT412(fVar1
                                                  ,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))))))));
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2500._4_4_ = fVar2;
  local_2500._0_4_ = fVar2;
  local_2500._8_4_ = fVar2;
  local_2500._12_4_ = fVar2;
  local_2500._16_4_ = fVar2;
  local_2500._20_4_ = fVar2;
  local_2500._24_4_ = fVar2;
  local_2500._28_4_ = fVar2;
  auVar64 = ZEXT3264(local_2500);
  fVar65 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_2520._4_4_ = fVar65;
  local_2520._0_4_ = fVar65;
  local_2520._8_4_ = fVar65;
  local_2520._12_4_ = fVar65;
  local_2520._16_4_ = fVar65;
  local_2520._20_4_ = fVar65;
  local_2520._24_4_ = fVar65;
  local_2520._28_4_ = fVar65;
  auVar67 = ZEXT3264(local_2520);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar65 = fVar65 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar25 = (tray->tfar).field_0.i[k];
  auVar43 = ZEXT3264(CONCAT428(iVar25,CONCAT424(iVar25,CONCAT420(iVar25,CONCAT416(iVar25,CONCAT412(
                                                  iVar25,CONCAT48(iVar25,CONCAT44(iVar25,iVar25)))))
                                               )));
  local_2540._8_4_ = 0x80000000;
  local_2540._0_8_ = 0x8000000080000000;
  local_2540._12_4_ = 0x80000000;
  local_2540._16_4_ = 0x80000000;
  local_2540._20_4_ = 0x80000000;
  local_2540._24_4_ = 0x80000000;
  local_2540._28_4_ = 0x80000000;
  local_2560._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_2560._8_4_ = -fVar1;
  local_2560._12_4_ = -fVar1;
  local_2560._16_4_ = -fVar1;
  local_2560._20_4_ = -fVar1;
  local_2560._24_4_ = -fVar1;
  local_2560._28_4_ = -fVar1;
  auVar71 = ZEXT3264(local_2560);
  local_2580._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_2580._8_4_ = -fVar2;
  local_2580._12_4_ = -fVar2;
  local_2580._16_4_ = -fVar2;
  local_2580._20_4_ = -fVar2;
  local_2580._24_4_ = -fVar2;
  local_2580._28_4_ = -fVar2;
  auVar76 = ZEXT3264(local_2580);
  iVar25 = (tray->tnear).field_0.i[k];
  local_25a0._4_4_ = iVar25;
  local_25a0._0_4_ = iVar25;
  local_25a0._8_4_ = iVar25;
  local_25a0._12_4_ = iVar25;
  local_25a0._16_4_ = iVar25;
  local_25a0._20_4_ = iVar25;
  local_25a0._24_4_ = iVar25;
  local_25a0._28_4_ = iVar25;
  auVar79 = ZEXT3264(local_25a0);
  local_25e0._16_16_ = mm_lookupmask_ps._240_16_;
  local_25e0._0_16_ = mm_lookupmask_ps._0_16_;
  local_25c0._0_8_ = CONCAT44(fVar65,fVar65) ^ 0x8000000080000000;
  local_25c0._8_4_ = -fVar65;
  local_25c0._12_4_ = -fVar65;
  local_25c0._16_4_ = -fVar65;
  local_25c0._20_4_ = -fVar65;
  local_25c0._24_4_ = -fVar65;
  local_25c0._28_4_ = -fVar65;
  auVar83 = ZEXT3264(local_25c0);
  iVar25 = 1 << ((uint)k & 0x1f);
  auVar63._4_4_ = iVar25;
  auVar63._0_4_ = iVar25;
  auVar63._8_4_ = iVar25;
  auVar63._12_4_ = iVar25;
  auVar63._16_4_ = iVar25;
  auVar63._20_4_ = iVar25;
  auVar63._24_4_ = iVar25;
  auVar63._28_4_ = iVar25;
  auVar46 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar63 = vpand_avx2(auVar63,auVar46);
  local_2620 = vpcmpeqd_avx2(auVar63,auVar46);
  auVar51._8_4_ = 0x3f800000;
  auVar51._0_8_ = 0x3f8000003f800000;
  auVar51._12_4_ = 0x3f800000;
  auVar51._16_4_ = 0x3f800000;
  auVar51._20_4_ = 0x3f800000;
  auVar51._24_4_ = 0x3f800000;
  auVar51._28_4_ = 0x3f800000;
  auVar46._8_4_ = 0xbf800000;
  auVar46._0_8_ = 0xbf800000bf800000;
  auVar46._12_4_ = 0xbf800000;
  auVar46._16_4_ = 0xbf800000;
  auVar46._20_4_ = 0xbf800000;
  auVar46._24_4_ = 0xbf800000;
  auVar46._28_4_ = 0xbf800000;
  local_2600 = vblendvps_avx(auVar51,auVar46,local_25e0);
LAB_016d3d29:
  do {
    do {
      if (pauVar39 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar30 = pauVar39 + -1;
      pauVar39 = pauVar39 + -1;
    } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar30 + 8));
    uVar36 = *(ulong *)*pauVar39;
    while ((uVar36 & 8) == 0) {
      auVar44 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar38),auVar71._0_32_,
                                auVar89._0_32_);
      auVar49 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar35),auVar76._0_32_,
                                auVar64._0_32_);
      auVar63 = vpmaxsd_avx2(ZEXT1632(auVar44),ZEXT1632(auVar49));
      auVar44 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar37),auVar83._0_32_,
                                auVar67._0_32_);
      auVar46 = vpmaxsd_avx2(ZEXT1632(auVar44),auVar79._0_32_);
      local_2840 = vpmaxsd_avx2(auVar63,auVar46);
      auVar44 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + (uVar38 ^ 0x20)),
                                auVar71._0_32_,auVar89._0_32_);
      auVar49 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + (uVar35 ^ 0x20)),
                                auVar76._0_32_,auVar64._0_32_);
      auVar63 = vpminsd_avx2(ZEXT1632(auVar44),ZEXT1632(auVar49));
      auVar44 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + (uVar37 ^ 0x20)),
                                auVar83._0_32_,auVar67._0_32_);
      auVar46 = vpminsd_avx2(ZEXT1632(auVar44),auVar43._0_32_);
      auVar63 = vpminsd_avx2(auVar63,auVar46);
      auVar63 = vpcmpgtd_avx2(local_2840,auVar63);
      iVar25 = vmovmskps_avx(auVar63);
      if (iVar25 == 0xff) goto LAB_016d3d29;
      bVar24 = ~(byte)iVar25;
      uVar33 = uVar36 & 0xfffffffffffffff0;
      lVar32 = 0;
      for (uVar36 = (ulong)bVar24; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
        lVar32 = lVar32 + 1;
      }
      uVar36 = *(ulong *)(uVar33 + lVar32 * 8);
      uVar26 = bVar24 - 1 & (uint)bVar24;
      uVar28 = (ulong)uVar26;
      if (uVar26 != 0) {
        uVar27 = *(uint *)(local_2840 + lVar32 * 4);
        lVar32 = 0;
        for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
          lVar32 = lVar32 + 1;
        }
        uVar26 = uVar26 - 1 & uVar26;
        uVar29 = (ulong)uVar26;
        uVar28 = *(ulong *)(uVar33 + lVar32 * 8);
        uVar72 = *(uint *)(local_2840 + lVar32 * 4);
        if (uVar26 == 0) {
          if (uVar27 < uVar72) {
            *(ulong *)*pauVar39 = uVar28;
            *(uint *)(*pauVar39 + 8) = uVar72;
            pauVar39 = pauVar39 + 1;
          }
          else {
            *(ulong *)*pauVar39 = uVar36;
            *(uint *)(*pauVar39 + 8) = uVar27;
            uVar36 = uVar28;
            pauVar39 = pauVar39 + 1;
          }
        }
        else {
          auVar44._8_8_ = 0;
          auVar44._0_8_ = uVar36;
          auVar44 = vpunpcklqdq_avx(auVar44,ZEXT416(uVar27));
          auVar49._8_8_ = 0;
          auVar49._0_8_ = uVar28;
          auVar49 = vpunpcklqdq_avx(auVar49,ZEXT416(uVar72));
          lVar32 = 0;
          for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
            lVar32 = lVar32 + 1;
          }
          uVar26 = uVar26 - 1 & uVar26;
          uVar36 = (ulong)uVar26;
          auVar54._8_8_ = 0;
          auVar54._0_8_ = *(ulong *)(uVar33 + lVar32 * 8);
          auVar45 = vpunpcklqdq_avx(auVar54,ZEXT416(*(uint *)(local_2840 + lVar32 * 4)));
          auVar54 = vpcmpgtd_avx(auVar49,auVar44);
          if (uVar26 == 0) {
            auVar59 = vpshufd_avx(auVar54,0xaa);
            auVar54 = vblendvps_avx(auVar49,auVar44,auVar59);
            auVar44 = vblendvps_avx(auVar44,auVar49,auVar59);
            auVar49 = vpcmpgtd_avx(auVar45,auVar54);
            auVar59 = vpshufd_avx(auVar49,0xaa);
            auVar49 = vblendvps_avx(auVar45,auVar54,auVar59);
            auVar54 = vblendvps_avx(auVar54,auVar45,auVar59);
            auVar45 = vpcmpgtd_avx(auVar54,auVar44);
            auVar59 = vpshufd_avx(auVar45,0xaa);
            auVar45 = vblendvps_avx(auVar54,auVar44,auVar59);
            auVar44 = vblendvps_avx(auVar44,auVar54,auVar59);
            *pauVar39 = auVar44;
            pauVar39[1] = auVar45;
            uVar36 = auVar49._0_8_;
            pauVar39 = pauVar39 + 2;
          }
          else {
            lVar32 = 0;
            for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
              lVar32 = lVar32 + 1;
            }
            uVar26 = uVar26 - 1 & uVar26;
            uVar36 = (ulong)uVar26;
            auVar59._8_8_ = 0;
            auVar59._0_8_ = *(ulong *)(uVar33 + lVar32 * 8);
            auVar59 = vpunpcklqdq_avx(auVar59,ZEXT416(*(uint *)(local_2840 + lVar32 * 4)));
            if (uVar26 == 0) {
              auVar50 = vpshufd_avx(auVar54,0xaa);
              auVar54 = vblendvps_avx(auVar49,auVar44,auVar50);
              auVar44 = vblendvps_avx(auVar44,auVar49,auVar50);
              auVar49 = vpcmpgtd_avx(auVar59,auVar45);
              auVar50 = vpshufd_avx(auVar49,0xaa);
              auVar49 = vblendvps_avx(auVar59,auVar45,auVar50);
              auVar45 = vblendvps_avx(auVar45,auVar59,auVar50);
              auVar59 = vpcmpgtd_avx(auVar45,auVar44);
              auVar50 = vpshufd_avx(auVar59,0xaa);
              auVar59 = vblendvps_avx(auVar45,auVar44,auVar50);
              auVar44 = vblendvps_avx(auVar44,auVar45,auVar50);
              auVar45 = vpcmpgtd_avx(auVar49,auVar54);
              auVar50 = vpshufd_avx(auVar45,0xaa);
              auVar45 = vblendvps_avx(auVar49,auVar54,auVar50);
              auVar49 = vblendvps_avx(auVar54,auVar49,auVar50);
              auVar54 = vpcmpgtd_avx(auVar59,auVar49);
              auVar50 = vpshufd_avx(auVar54,0xaa);
              auVar54 = vblendvps_avx(auVar59,auVar49,auVar50);
              auVar49 = vblendvps_avx(auVar49,auVar59,auVar50);
              *pauVar39 = auVar44;
              pauVar39[1] = auVar49;
              pauVar39[2] = auVar54;
              uVar36 = auVar45._0_8_;
              pauVar39 = pauVar39 + 3;
            }
            else {
              *pauVar39 = auVar44;
              pauVar39[1] = auVar49;
              pauVar39[2] = auVar45;
              pauVar30 = pauVar39 + 3;
              pauVar39[3] = auVar59;
              do {
                lVar32 = 0;
                for (uVar28 = uVar36; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000)
                {
                  lVar32 = lVar32 + 1;
                }
                auVar45._8_8_ = 0;
                auVar45._0_8_ = *(ulong *)(uVar33 + lVar32 * 8);
                auVar44 = vpunpcklqdq_avx(auVar45,ZEXT416(*(uint *)(local_2840 + lVar32 * 4)));
                pauVar30[1] = auVar44;
                pauVar30 = pauVar30 + 1;
                uVar36 = uVar36 - 1 & uVar36;
              } while (uVar36 != 0);
              lVar32 = 0;
              while (pauVar30 != pauVar39) {
                auVar44 = pauVar39[1];
                uVar26 = vextractps_avx(auVar44,2);
                for (lVar34 = 0x10;
                    (lVar32 != lVar34 && (*(uint *)(pauVar39[-1] + lVar34 + 8) < uVar26));
                    lVar34 = lVar34 + -0x10) {
                  *(undefined1 (*) [16])(*pauVar39 + lVar34) =
                       *(undefined1 (*) [16])(pauVar39[-1] + lVar34);
                }
                *(undefined1 (*) [16])(*pauVar39 + lVar34) = auVar44;
                lVar32 = lVar32 + -0x10;
                pauVar39 = pauVar39 + 1;
              }
              uVar36 = *(ulong *)*pauVar30;
              pauVar39 = pauVar30;
            }
          }
        }
      }
    }
    uVar33 = uVar36 & 0xfffffffffffffff0;
    for (lVar32 = 0; lVar32 != (ulong)((uint)uVar36 & 0xf) - 8; lVar32 = lVar32 + 1) {
      lVar31 = lVar32 * 0xe0;
      lVar34 = uVar33 + 0xd0 + lVar31;
      local_2860 = *(undefined8 *)(lVar34 + 0x10);
      uStack_2858 = *(undefined8 *)(lVar34 + 0x18);
      lVar34 = uVar33 + 0xc0 + lVar31;
      local_24e0 = *(undefined8 *)(lVar34 + 0x10);
      uStack_24d8 = *(undefined8 *)(lVar34 + 0x18);
      uStack_24d0 = local_24e0;
      uStack_24c8 = uStack_24d8;
      uStack_2850 = local_2860;
      uStack_2848 = uStack_2858;
      auVar56._16_16_ = *(undefined1 (*) [16])(uVar33 + 0x60 + lVar31);
      auVar56._0_16_ = *(undefined1 (*) [16])(uVar33 + lVar31);
      auVar60._16_16_ = *(undefined1 (*) [16])(uVar33 + 0x70 + lVar31);
      auVar60._0_16_ = *(undefined1 (*) [16])(uVar33 + 0x10 + lVar31);
      auVar62._16_16_ = *(undefined1 (*) [16])(uVar33 + 0x80 + lVar31);
      auVar62._0_16_ = *(undefined1 (*) [16])(uVar33 + 0x20 + lVar31);
      auVar44 = *(undefined1 (*) [16])(uVar33 + 0x30 + lVar31);
      auVar40._16_16_ = auVar44;
      auVar40._0_16_ = auVar44;
      auVar49 = *(undefined1 (*) [16])(uVar33 + 0x40 + lVar31);
      auVar47._16_16_ = auVar49;
      auVar47._0_16_ = auVar49;
      auVar54 = *(undefined1 (*) [16])(uVar33 + 0x50 + lVar31);
      auVar52._16_16_ = auVar54;
      auVar52._0_16_ = auVar54;
      auVar54 = *(undefined1 (*) [16])(uVar33 + 0x90 + lVar31);
      auVar58._16_16_ = auVar54;
      auVar58._0_16_ = auVar54;
      auVar54 = *(undefined1 (*) [16])(uVar33 + 0xa0 + lVar31);
      auVar74._16_16_ = auVar54;
      auVar74._0_16_ = auVar54;
      auVar54 = *(undefined1 (*) [16])(uVar33 + 0xb0 + lVar31);
      auVar77._16_16_ = auVar54;
      auVar77._0_16_ = auVar54;
      auVar46 = vsubps_avx(auVar56,auVar40);
      auVar63 = vsubps_avx(auVar60,auVar47);
      auVar51 = vsubps_avx(auVar62,auVar52);
      auVar40 = vsubps_avx(auVar58,auVar56);
      auVar12 = vsubps_avx(auVar74,auVar60);
      auVar13 = vsubps_avx(auVar77,auVar62);
      auVar14._4_4_ = auVar63._4_4_ * auVar13._4_4_;
      auVar14._0_4_ = auVar63._0_4_ * auVar13._0_4_;
      auVar14._8_4_ = auVar63._8_4_ * auVar13._8_4_;
      auVar14._12_4_ = auVar63._12_4_ * auVar13._12_4_;
      auVar14._16_4_ = auVar63._16_4_ * auVar13._16_4_;
      auVar14._20_4_ = auVar63._20_4_ * auVar13._20_4_;
      auVar14._24_4_ = auVar63._24_4_ * auVar13._24_4_;
      auVar14._28_4_ = auVar44._12_4_;
      auVar45 = vfmsub231ps_fma(auVar14,auVar12,auVar51);
      uVar84 = *(undefined4 *)(ray + k * 4);
      auVar80._4_4_ = uVar84;
      auVar80._0_4_ = uVar84;
      auVar80._8_4_ = uVar84;
      auVar80._12_4_ = uVar84;
      auVar80._16_4_ = uVar84;
      auVar80._20_4_ = uVar84;
      auVar80._24_4_ = uVar84;
      auVar80._28_4_ = uVar84;
      uVar84 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar85._4_4_ = uVar84;
      auVar85._0_4_ = uVar84;
      auVar85._8_4_ = uVar84;
      auVar85._12_4_ = uVar84;
      auVar85._16_4_ = uVar84;
      auVar85._20_4_ = uVar84;
      auVar85._24_4_ = uVar84;
      auVar85._28_4_ = uVar84;
      uVar84 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar87._4_4_ = uVar84;
      auVar87._0_4_ = uVar84;
      auVar87._8_4_ = uVar84;
      auVar87._12_4_ = uVar84;
      auVar87._16_4_ = uVar84;
      auVar87._20_4_ = uVar84;
      auVar87._24_4_ = uVar84;
      auVar87._28_4_ = uVar84;
      fVar1 = *(float *)(ray + k * 4 + 0x80);
      auVar75._4_4_ = fVar1;
      auVar75._0_4_ = fVar1;
      auVar75._8_4_ = fVar1;
      auVar75._12_4_ = fVar1;
      auVar75._16_4_ = fVar1;
      auVar75._20_4_ = fVar1;
      auVar75._24_4_ = fVar1;
      auVar75._28_4_ = fVar1;
      auVar15._4_4_ = auVar51._4_4_ * auVar40._4_4_;
      auVar15._0_4_ = auVar51._0_4_ * auVar40._0_4_;
      auVar15._8_4_ = auVar51._8_4_ * auVar40._8_4_;
      auVar15._12_4_ = auVar51._12_4_ * auVar40._12_4_;
      auVar15._16_4_ = auVar51._16_4_ * auVar40._16_4_;
      auVar15._20_4_ = auVar51._20_4_ * auVar40._20_4_;
      auVar15._24_4_ = auVar51._24_4_ * auVar40._24_4_;
      auVar15._28_4_ = auVar49._12_4_;
      auVar14 = vsubps_avx(auVar56,auVar80);
      fVar2 = *(float *)(ray + k * 4 + 0xa0);
      auVar81._4_4_ = fVar2;
      auVar81._0_4_ = fVar2;
      auVar81._8_4_ = fVar2;
      auVar81._12_4_ = fVar2;
      auVar81._16_4_ = fVar2;
      auVar81._20_4_ = fVar2;
      auVar81._24_4_ = fVar2;
      auVar81._28_4_ = fVar2;
      auVar59 = vfmsub231ps_fma(auVar15,auVar13,auVar46);
      auVar15 = vsubps_avx(auVar60,auVar85);
      fVar65 = *(float *)(ray + k * 4 + 0xc0);
      auVar86._4_4_ = fVar65;
      auVar86._0_4_ = fVar65;
      auVar86._8_4_ = fVar65;
      auVar86._12_4_ = fVar65;
      auVar86._16_4_ = fVar65;
      auVar86._20_4_ = fVar65;
      auVar86._24_4_ = fVar65;
      auVar86._28_4_ = fVar65;
      auVar47 = vsubps_avx(auVar62,auVar87);
      auVar16._4_4_ = fVar1 * auVar15._4_4_;
      auVar16._0_4_ = fVar1 * auVar15._0_4_;
      auVar16._8_4_ = fVar1 * auVar15._8_4_;
      auVar16._12_4_ = fVar1 * auVar15._12_4_;
      auVar16._16_4_ = fVar1 * auVar15._16_4_;
      auVar16._20_4_ = fVar1 * auVar15._20_4_;
      auVar16._24_4_ = fVar1 * auVar15._24_4_;
      auVar16._28_4_ = uVar84;
      auVar44 = vfmsub231ps_fma(auVar16,auVar14,auVar81);
      auVar17._4_4_ = auVar13._4_4_ * auVar44._4_4_;
      auVar17._0_4_ = auVar13._0_4_ * auVar44._0_4_;
      auVar17._8_4_ = auVar13._8_4_ * auVar44._8_4_;
      auVar17._12_4_ = auVar13._12_4_ * auVar44._12_4_;
      auVar17._16_4_ = auVar13._16_4_ * 0.0;
      auVar17._20_4_ = auVar13._20_4_ * 0.0;
      auVar17._24_4_ = auVar13._24_4_ * 0.0;
      auVar17._28_4_ = auVar13._28_4_;
      auVar88._0_4_ = auVar51._0_4_ * auVar44._0_4_;
      auVar88._4_4_ = auVar51._4_4_ * auVar44._4_4_;
      auVar88._8_4_ = auVar51._8_4_ * auVar44._8_4_;
      auVar88._12_4_ = auVar51._12_4_ * auVar44._12_4_;
      auVar88._16_4_ = auVar51._16_4_ * 0.0;
      auVar88._20_4_ = auVar51._20_4_ * 0.0;
      auVar88._24_4_ = auVar51._24_4_ * 0.0;
      auVar88._28_4_ = 0;
      auVar13._4_4_ = fVar65 * auVar14._4_4_;
      auVar13._0_4_ = fVar65 * auVar14._0_4_;
      auVar13._8_4_ = fVar65 * auVar14._8_4_;
      auVar13._12_4_ = fVar65 * auVar14._12_4_;
      auVar13._16_4_ = fVar65 * auVar14._16_4_;
      auVar13._20_4_ = fVar65 * auVar14._20_4_;
      auVar13._24_4_ = fVar65 * auVar14._24_4_;
      auVar13._28_4_ = auVar51._28_4_;
      auVar49 = vfmsub231ps_fma(auVar13,auVar47,auVar75);
      auVar44 = vfmadd231ps_fma(auVar17,ZEXT1632(auVar49),auVar12);
      auVar49 = vfmadd231ps_fma(auVar88,auVar63,ZEXT1632(auVar49));
      auVar18._4_4_ = auVar46._4_4_ * auVar12._4_4_;
      auVar18._0_4_ = auVar46._0_4_ * auVar12._0_4_;
      auVar18._8_4_ = auVar46._8_4_ * auVar12._8_4_;
      auVar18._12_4_ = auVar46._12_4_ * auVar12._12_4_;
      auVar18._16_4_ = auVar46._16_4_ * auVar12._16_4_;
      auVar18._20_4_ = auVar46._20_4_ * auVar12._20_4_;
      auVar18._24_4_ = auVar46._24_4_ * auVar12._24_4_;
      auVar18._28_4_ = auVar12._28_4_;
      auVar50 = vfmsub231ps_fma(auVar18,auVar40,auVar63);
      auVar12._4_4_ = fVar2 * auVar47._4_4_;
      auVar12._0_4_ = fVar2 * auVar47._0_4_;
      auVar12._8_4_ = fVar2 * auVar47._8_4_;
      auVar12._12_4_ = fVar2 * auVar47._12_4_;
      auVar12._16_4_ = fVar2 * auVar47._16_4_;
      auVar12._20_4_ = fVar2 * auVar47._20_4_;
      auVar12._24_4_ = fVar2 * auVar47._24_4_;
      auVar12._28_4_ = auVar63._28_4_;
      auVar55 = vfmsub231ps_fma(auVar12,auVar15,auVar86);
      fVar1 = auVar50._0_4_;
      fVar2 = auVar50._4_4_;
      auVar19._4_4_ = fVar65 * fVar2;
      auVar19._0_4_ = fVar65 * fVar1;
      fVar7 = auVar50._8_4_;
      auVar19._8_4_ = fVar65 * fVar7;
      fVar8 = auVar50._12_4_;
      auVar19._12_4_ = fVar65 * fVar8;
      auVar19._16_4_ = fVar65 * 0.0;
      auVar19._20_4_ = fVar65 * 0.0;
      auVar19._24_4_ = fVar65 * 0.0;
      auVar19._28_4_ = fVar65;
      auVar54 = vfmadd231ps_fma(auVar19,ZEXT1632(auVar59),auVar81);
      auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),ZEXT1632(auVar45),auVar75);
      auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),ZEXT1632(auVar55),auVar40);
      auVar63 = vandps_avx(ZEXT1632(auVar54),local_2540);
      uVar26 = auVar63._0_4_;
      local_2840._0_4_ = (float)(uVar26 ^ auVar44._0_4_);
      uVar27 = auVar63._4_4_;
      local_2840._4_4_ = (float)(uVar27 ^ auVar44._4_4_);
      uVar72 = auVar63._8_4_;
      local_2840._8_4_ = (float)(uVar72 ^ auVar44._8_4_);
      uVar73 = auVar63._12_4_;
      local_2840._12_4_ = (float)(uVar73 ^ auVar44._12_4_);
      local_2800._16_4_ = auVar63._16_4_;
      local_2840._16_4_ = local_2800._16_4_;
      local_2800._20_4_ = auVar63._20_4_;
      local_2840._20_4_ = local_2800._20_4_;
      local_2800._24_4_ = auVar63._24_4_;
      local_2840._24_4_ = local_2800._24_4_;
      local_2800._28_4_ = auVar63._28_4_;
      local_2840._28_4_ = local_2800._28_4_;
      auVar44 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar46,ZEXT1632(auVar55));
      local_2820._0_4_ = (float)(uVar26 ^ auVar44._0_4_);
      local_2820._4_4_ = (float)(uVar27 ^ auVar44._4_4_);
      local_2820._8_4_ = (float)(uVar72 ^ auVar44._8_4_);
      local_2820._12_4_ = (float)(uVar73 ^ auVar44._12_4_);
      local_2820._16_4_ = local_2800._16_4_;
      local_2820._20_4_ = local_2800._20_4_;
      local_2820._24_4_ = local_2800._24_4_;
      local_2820._28_4_ = local_2800._28_4_;
      auVar63 = vcmpps_avx(local_2840,ZEXT832(0) << 0x20,5);
      auVar46 = vcmpps_avx(local_2820,ZEXT832(0) << 0x20,5);
      auVar63 = vandps_avx(auVar63,auVar46);
      auVar66._8_4_ = 0x7fffffff;
      auVar66._0_8_ = 0x7fffffff7fffffff;
      auVar66._12_4_ = 0x7fffffff;
      auVar66._16_4_ = 0x7fffffff;
      auVar66._20_4_ = 0x7fffffff;
      auVar66._24_4_ = 0x7fffffff;
      auVar66._28_4_ = 0x7fffffff;
      local_27e0 = vandps_avx(ZEXT1632(auVar54),auVar66);
      auVar46 = vcmpps_avx(ZEXT1632(auVar54),ZEXT832(0) << 0x20,4);
      auVar63 = vandps_avx(auVar63,auVar46);
      auVar78._0_4_ = local_2840._0_4_ + local_2820._0_4_;
      auVar78._4_4_ = local_2840._4_4_ + local_2820._4_4_;
      auVar78._8_4_ = local_2840._8_4_ + local_2820._8_4_;
      auVar78._12_4_ = local_2840._12_4_ + local_2820._12_4_;
      auVar78._16_4_ = local_2800._16_4_ + local_2800._16_4_;
      auVar78._20_4_ = local_2800._20_4_ + local_2800._20_4_;
      auVar78._24_4_ = local_2800._24_4_ + local_2800._24_4_;
      auVar78._28_4_ = local_2800._28_4_ + local_2800._28_4_;
      auVar46 = vcmpps_avx(auVar78,local_27e0,2);
      auVar51 = auVar46 & auVar63;
      if ((((((((auVar51 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar51 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar51 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar51 >> 0x7f,0) != '\0') ||
            (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar51 >> 0xbf,0) != '\0') ||
          (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar51[0x1f] < '\0') {
        auVar63 = vandps_avx(auVar63,auVar46);
        auVar44 = vpackssdw_avx(auVar63._0_16_,auVar63._16_16_);
        auVar20._4_4_ = fVar2 * auVar47._4_4_;
        auVar20._0_4_ = fVar1 * auVar47._0_4_;
        auVar20._8_4_ = fVar7 * auVar47._8_4_;
        auVar20._12_4_ = fVar8 * auVar47._12_4_;
        auVar20._16_4_ = auVar47._16_4_ * 0.0;
        auVar20._20_4_ = auVar47._20_4_ * 0.0;
        auVar20._24_4_ = auVar47._24_4_ * 0.0;
        auVar20._28_4_ = auVar47._28_4_;
        auVar49 = vfmadd213ps_fma(auVar15,ZEXT1632(auVar59),auVar20);
        auVar49 = vfmadd213ps_fma(auVar14,ZEXT1632(auVar45),ZEXT1632(auVar49));
        local_2800._0_4_ = (float)(uVar26 ^ auVar49._0_4_);
        local_2800._4_4_ = (float)(uVar27 ^ auVar49._4_4_);
        local_2800._8_4_ = (float)(uVar72 ^ auVar49._8_4_);
        local_2800._12_4_ = (float)(uVar73 ^ auVar49._12_4_);
        fVar65 = *(float *)(ray + k * 4 + 0x60);
        auVar21._4_4_ = local_27e0._4_4_ * fVar65;
        auVar21._0_4_ = local_27e0._0_4_ * fVar65;
        auVar21._8_4_ = local_27e0._8_4_ * fVar65;
        auVar21._12_4_ = local_27e0._12_4_ * fVar65;
        auVar21._16_4_ = local_27e0._16_4_ * fVar65;
        auVar21._20_4_ = local_27e0._20_4_ * fVar65;
        auVar21._24_4_ = local_27e0._24_4_ * fVar65;
        auVar21._28_4_ = fVar65;
        auVar63 = vcmpps_avx(auVar21,local_2800,1);
        fVar65 = *(float *)(ray + k * 4 + 0x100);
        auVar43 = ZEXT3264(CONCAT428(fVar65,CONCAT424(fVar65,CONCAT420(fVar65,CONCAT416(fVar65,
                                                  CONCAT412(fVar65,CONCAT48(fVar65,CONCAT44(fVar65,
                                                  fVar65))))))));
        auVar61._0_4_ = local_27e0._0_4_ * fVar65;
        auVar61._4_4_ = local_27e0._4_4_ * fVar65;
        auVar61._8_4_ = local_27e0._8_4_ * fVar65;
        auVar61._12_4_ = local_27e0._12_4_ * fVar65;
        auVar61._16_4_ = local_27e0._16_4_ * fVar65;
        auVar61._20_4_ = local_27e0._20_4_ * fVar65;
        auVar61._24_4_ = local_27e0._24_4_ * fVar65;
        auVar61._28_4_ = 0;
        auVar46 = vcmpps_avx(local_2800,auVar61,2);
        auVar63 = vandps_avx(auVar63,auVar46);
        auVar49 = vpackssdw_avx(auVar63._0_16_,auVar63._16_16_);
        auVar44 = vpand_avx(auVar44,auVar49);
        auVar63 = vpmovzxwd_avx2(auVar44);
        auVar63 = vpslld_avx2(auVar63,0x1f);
        if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar63 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar63 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar63 >> 0x7f,0) != '\0') ||
              (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar63 >> 0xbf,0) != '\0') ||
            (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar63[0x1f] < '\0') {
          local_28c0 = vpsrad_avx2(auVar63,0x1f);
          local_27c0 = ZEXT1632(auVar45);
          local_27a0 = ZEXT1632(auVar59);
          local_2780 = ZEXT1632(auVar50);
          local_2760 = local_28c0;
          local_2680 = local_25e0;
          pSVar4 = context->scene;
          auVar46 = vrcpps_avx(local_27e0);
          auVar82._8_4_ = 0x3f800000;
          auVar82._0_8_ = 0x3f8000003f800000;
          auVar82._12_4_ = 0x3f800000;
          auVar82._16_4_ = 0x3f800000;
          auVar82._20_4_ = 0x3f800000;
          auVar82._24_4_ = 0x3f800000;
          auVar82._28_4_ = 0x3f800000;
          auVar49 = vfnmadd213ps_fma(local_27e0,auVar46,auVar82);
          auVar49 = vfmadd132ps_fma(ZEXT1632(auVar49),auVar46,auVar46);
          fVar65 = auVar49._0_4_;
          fVar68 = auVar49._4_4_;
          local_2700._4_4_ = fVar68 * local_2800._4_4_;
          local_2700._0_4_ = fVar65 * local_2800._0_4_;
          fVar69 = auVar49._8_4_;
          local_2700._8_4_ = fVar69 * local_2800._8_4_;
          fVar70 = auVar49._12_4_;
          local_2700._12_4_ = fVar70 * local_2800._12_4_;
          local_2700._16_4_ = local_2800._16_4_ * 0.0;
          local_2700._20_4_ = local_2800._20_4_ * 0.0;
          local_2700._24_4_ = local_2800._24_4_ * 0.0;
          local_2700._28_4_ = auVar46._28_4_;
          auVar64 = ZEXT3264(local_2700);
          auVar22._4_4_ = fVar68 * local_2840._4_4_;
          auVar22._0_4_ = fVar65 * local_2840._0_4_;
          auVar22._8_4_ = fVar69 * local_2840._8_4_;
          auVar22._12_4_ = fVar70 * local_2840._12_4_;
          auVar22._16_4_ = local_2800._16_4_ * 0.0;
          auVar22._20_4_ = local_2800._20_4_ * 0.0;
          auVar22._24_4_ = local_2800._24_4_ * 0.0;
          auVar22._28_4_ = local_2800._28_4_;
          auVar46 = vminps_avx(auVar22,auVar82);
          auVar23._4_4_ = fVar68 * local_2820._4_4_;
          auVar23._0_4_ = fVar65 * local_2820._0_4_;
          auVar23._8_4_ = fVar69 * local_2820._8_4_;
          auVar23._12_4_ = fVar70 * local_2820._12_4_;
          auVar23._16_4_ = local_2800._16_4_ * 0.0;
          auVar23._20_4_ = local_2800._20_4_ * 0.0;
          auVar23._24_4_ = local_2800._24_4_ * 0.0;
          auVar23._28_4_ = local_2800._28_4_;
          auVar51 = vminps_avx(auVar23,auVar82);
          auVar40 = vsubps_avx(auVar82,auVar46);
          auVar12 = vsubps_avx(auVar82,auVar51);
          local_2720 = vblendvps_avx(auVar51,auVar40,local_25e0);
          local_2740 = vblendvps_avx(auVar46,auVar12,local_25e0);
          fVar65 = local_2600._0_4_;
          local_26e0._0_4_ = auVar45._0_4_ * fVar65;
          fVar68 = local_2600._4_4_;
          local_26e0._4_4_ = auVar45._4_4_ * fVar68;
          fVar69 = local_2600._8_4_;
          local_26e0._8_4_ = auVar45._8_4_ * fVar69;
          fVar70 = local_2600._12_4_;
          local_26e0._12_4_ = auVar45._12_4_ * fVar70;
          fVar9 = local_2600._16_4_;
          local_26e0._16_4_ = fVar9 * 0.0;
          fVar10 = local_2600._20_4_;
          local_26e0._20_4_ = fVar10 * 0.0;
          fVar11 = local_2600._24_4_;
          local_26e0._24_4_ = fVar11 * 0.0;
          local_26e0._28_4_ = 0;
          local_26c0._0_4_ = fVar65 * auVar59._0_4_;
          local_26c0._4_4_ = fVar68 * auVar59._4_4_;
          local_26c0._8_4_ = fVar69 * auVar59._8_4_;
          local_26c0._12_4_ = fVar70 * auVar59._12_4_;
          local_26c0._16_4_ = fVar9 * 0.0;
          local_26c0._20_4_ = fVar10 * 0.0;
          local_26c0._24_4_ = fVar11 * 0.0;
          local_26c0._28_4_ = 0;
          local_26a0._0_4_ = fVar65 * fVar1;
          local_26a0._4_4_ = fVar68 * fVar2;
          local_26a0._8_4_ = fVar69 * fVar7;
          local_26a0._12_4_ = fVar70 * fVar8;
          local_26a0._16_4_ = fVar9 * 0.0;
          local_26a0._20_4_ = fVar10 * 0.0;
          local_26a0._24_4_ = fVar11 * 0.0;
          local_26a0._28_4_ = 0;
          auVar41._8_4_ = 0x7f800000;
          auVar41._0_8_ = 0x7f8000007f800000;
          auVar41._12_4_ = 0x7f800000;
          auVar41._16_4_ = 0x7f800000;
          auVar41._20_4_ = 0x7f800000;
          auVar41._24_4_ = 0x7f800000;
          auVar41._28_4_ = 0x7f800000;
          auVar63 = vblendvps_avx(auVar41,local_2700,auVar63);
          auVar46 = vshufps_avx(auVar63,auVar63,0xb1);
          auVar46 = vminps_avx(auVar63,auVar46);
          auVar51 = vshufpd_avx(auVar46,auVar46,5);
          auVar46 = vminps_avx(auVar46,auVar51);
          auVar51 = vpermpd_avx2(auVar46,0x4e);
          auVar46 = vminps_avx(auVar46,auVar51);
          auVar63 = vcmpps_avx(auVar63,auVar46,0);
          auVar49 = vpackssdw_avx(auVar63._0_16_,auVar63._16_16_);
          auVar44 = vpand_avx(auVar49,auVar44);
          auVar63 = vpmovzxwd_avx2(auVar44);
          auVar63 = vpslld_avx2(auVar63,0x1f);
          if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar63 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar63 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar63 >> 0x7f,0) == '\0') &&
                (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar63 >> 0xbf,0) == '\0') &&
              (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar63[0x1f]) {
            auVar63 = local_28c0;
          }
          uVar27 = vmovmskps_avx(auVar63);
          uVar26 = 0;
          for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x80000000) {
            uVar26 = uVar26 + 1;
          }
          do {
            uVar28 = (ulong)uVar26;
            uVar26 = *(uint *)((long)&local_24e0 + uVar28 * 4);
            pGVar5 = (pSVar4->geometries).items[uVar26].ptr;
            if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
              *(undefined4 *)(local_28c0 + uVar28 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar84 = *(undefined4 *)(local_2740 + uVar28 * 4);
                uVar3 = *(undefined4 *)(local_2720 + uVar28 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2700 + uVar28 * 4);
                *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_26e0 + uVar28 * 4);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_26c0 + uVar28 * 4);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_26a0 + uVar28 * 4);
                *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar84;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar3;
                *(undefined4 *)(ray + k * 4 + 0x220) =
                     *(undefined4 *)((long)&local_2860 + uVar28 * 4);
                *(uint *)(ray + k * 4 + 0x240) = uVar26;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                break;
              }
              local_2660 = auVar64._0_32_;
              local_28a0 = auVar43._0_32_;
              local_2640 = auVar89._0_32_;
              uVar84 = *(undefined4 *)(local_2740 + uVar28 * 4);
              local_2460._4_4_ = uVar84;
              local_2460._0_4_ = uVar84;
              local_2460._8_4_ = uVar84;
              local_2460._12_4_ = uVar84;
              local_2460._16_4_ = uVar84;
              local_2460._20_4_ = uVar84;
              local_2460._24_4_ = uVar84;
              local_2460._28_4_ = uVar84;
              local_2440 = *(undefined4 *)(local_2720 + uVar28 * 4);
              uVar84 = *(undefined4 *)((long)&local_2860 + uVar28 * 4);
              auVar55._4_4_ = uVar84;
              auVar55._0_4_ = uVar84;
              auVar55._8_4_ = uVar84;
              auVar55._12_4_ = uVar84;
              auVar57._16_4_ = uVar84;
              auVar57._0_16_ = auVar55;
              auVar57._20_4_ = uVar84;
              auVar57._24_4_ = uVar84;
              auVar57._28_4_ = uVar84;
              uVar84 = *(undefined4 *)(local_26e0 + uVar28 * 4);
              uVar3 = *(undefined4 *)(local_26c0 + uVar28 * 4);
              local_24a0._4_4_ = uVar3;
              local_24a0._0_4_ = uVar3;
              local_24a0._8_4_ = uVar3;
              local_24a0._12_4_ = uVar3;
              local_24a0._16_4_ = uVar3;
              local_24a0._20_4_ = uVar3;
              local_24a0._24_4_ = uVar3;
              local_24a0._28_4_ = uVar3;
              uVar3 = *(undefined4 *)(local_26a0 + uVar28 * 4);
              local_2480._4_4_ = uVar3;
              local_2480._0_4_ = uVar3;
              local_2480._8_4_ = uVar3;
              local_2480._12_4_ = uVar3;
              local_2480._16_4_ = uVar3;
              local_2480._20_4_ = uVar3;
              local_2480._24_4_ = uVar3;
              local_2480._28_4_ = uVar3;
              auVar50._4_4_ = uVar26;
              auVar50._0_4_ = uVar26;
              auVar50._8_4_ = uVar26;
              auVar50._12_4_ = uVar26;
              auVar53._16_4_ = uVar26;
              auVar53._0_16_ = auVar50;
              auVar53._20_4_ = uVar26;
              auVar53._24_4_ = uVar26;
              auVar53._28_4_ = uVar26;
              local_24c0[0] = (RTCHitN)(char)uVar84;
              local_24c0[1] = (RTCHitN)(char)((uint)uVar84 >> 8);
              local_24c0[2] = (RTCHitN)(char)((uint)uVar84 >> 0x10);
              local_24c0[3] = (RTCHitN)(char)((uint)uVar84 >> 0x18);
              local_24c0[4] = (RTCHitN)(char)uVar84;
              local_24c0[5] = (RTCHitN)(char)((uint)uVar84 >> 8);
              local_24c0[6] = (RTCHitN)(char)((uint)uVar84 >> 0x10);
              local_24c0[7] = (RTCHitN)(char)((uint)uVar84 >> 0x18);
              local_24c0[8] = (RTCHitN)(char)uVar84;
              local_24c0[9] = (RTCHitN)(char)((uint)uVar84 >> 8);
              local_24c0[10] = (RTCHitN)(char)((uint)uVar84 >> 0x10);
              local_24c0[0xb] = (RTCHitN)(char)((uint)uVar84 >> 0x18);
              local_24c0[0xc] = (RTCHitN)(char)uVar84;
              local_24c0[0xd] = (RTCHitN)(char)((uint)uVar84 >> 8);
              local_24c0[0xe] = (RTCHitN)(char)((uint)uVar84 >> 0x10);
              local_24c0[0xf] = (RTCHitN)(char)((uint)uVar84 >> 0x18);
              local_24c0[0x10] = (RTCHitN)(char)uVar84;
              local_24c0[0x11] = (RTCHitN)(char)((uint)uVar84 >> 8);
              local_24c0[0x12] = (RTCHitN)(char)((uint)uVar84 >> 0x10);
              local_24c0[0x13] = (RTCHitN)(char)((uint)uVar84 >> 0x18);
              local_24c0[0x14] = (RTCHitN)(char)uVar84;
              local_24c0[0x15] = (RTCHitN)(char)((uint)uVar84 >> 8);
              local_24c0[0x16] = (RTCHitN)(char)((uint)uVar84 >> 0x10);
              local_24c0[0x17] = (RTCHitN)(char)((uint)uVar84 >> 0x18);
              local_24c0[0x18] = (RTCHitN)(char)uVar84;
              local_24c0[0x19] = (RTCHitN)(char)((uint)uVar84 >> 8);
              local_24c0[0x1a] = (RTCHitN)(char)((uint)uVar84 >> 0x10);
              local_24c0[0x1b] = (RTCHitN)(char)((uint)uVar84 >> 0x18);
              local_24c0[0x1c] = (RTCHitN)(char)uVar84;
              local_24c0[0x1d] = (RTCHitN)(char)((uint)uVar84 >> 8);
              local_24c0[0x1e] = (RTCHitN)(char)((uint)uVar84 >> 0x10);
              local_24c0[0x1f] = (RTCHitN)(char)((uint)uVar84 >> 0x18);
              uStack_243c = local_2440;
              uStack_2438 = local_2440;
              uStack_2434 = local_2440;
              uStack_2430 = local_2440;
              uStack_242c = local_2440;
              uStack_2428 = local_2440;
              uStack_2424 = local_2440;
              local_2420 = auVar57;
              local_2400 = auVar53;
              vpcmpeqd_avx2(local_2460,local_2460);
              uStack_23dc = context->user->instID[0];
              local_23e0 = uStack_23dc;
              uStack_23d8 = uStack_23dc;
              uStack_23d4 = uStack_23dc;
              uStack_23d0 = uStack_23dc;
              uStack_23cc = uStack_23dc;
              uStack_23c8 = uStack_23dc;
              uStack_23c4 = uStack_23dc;
              uStack_23bc = context->user->instPrimID[0];
              local_23c0 = uStack_23bc;
              uStack_23b8 = uStack_23bc;
              uStack_23b4 = uStack_23bc;
              uStack_23b0 = uStack_23bc;
              uStack_23ac = uStack_23bc;
              uStack_23a8 = uStack_23bc;
              uStack_23a4 = uStack_23bc;
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2700 + uVar28 * 4);
              local_2880 = local_2620;
              local_28f0.valid = (int *)local_2880;
              local_28f0.geometryUserPtr = pGVar5->userPtr;
              local_28f0.context = context->user;
              local_28f0.hit = local_24c0;
              local_28f0.N = 8;
              local_28f0.ray = (RTCRayN *)ray;
              if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                auVar53 = ZEXT1632(auVar50);
                auVar57 = ZEXT1632(auVar55);
                (*pGVar5->intersectionFilterN)(&local_28f0);
              }
              auVar46 = vpcmpeqd_avx2(local_2880,_DAT_01f7b000);
              auVar63 = _DAT_01f7b020 & ~auVar46;
              if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar63 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar63 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar63 >> 0x7f,0) == '\0') &&
                    (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar63 >> 0xbf,0) == '\0') &&
                  (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar63[0x1f]) {
                auVar46 = auVar46 ^ _DAT_01f7b020;
              }
              else {
                p_Var6 = context->args->filter;
                if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))))
                {
                  auVar53 = ZEXT1632(auVar53._0_16_);
                  auVar57 = ZEXT1632(auVar57._0_16_);
                  (*p_Var6)(&local_28f0);
                }
                auVar51 = vpcmpeqd_avx2(local_2880,_DAT_01f7b000);
                auVar63 = vpcmpeqd_avx2(auVar57,auVar57);
                auVar46 = auVar51 ^ auVar63;
                auVar40 = vpcmpeqd_avx2(auVar53,auVar53);
                auVar63 = auVar63 & ~auVar51;
                if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar63 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar63 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar63 >> 0x7f,0) != '\0') ||
                      (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar63 >> 0xbf,0) != '\0') ||
                    (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar63[0x1f] < '\0') {
                  auVar51 = auVar51 ^ auVar40;
                  auVar63 = vmaskmovps_avx(auVar51,*(undefined1 (*) [32])local_28f0.hit);
                  *(undefined1 (*) [32])(local_28f0.ray + 0x180) = auVar63;
                  auVar63 = vmaskmovps_avx(auVar51,*(undefined1 (*) [32])(local_28f0.hit + 0x20));
                  *(undefined1 (*) [32])(local_28f0.ray + 0x1a0) = auVar63;
                  auVar63 = vmaskmovps_avx(auVar51,*(undefined1 (*) [32])(local_28f0.hit + 0x40));
                  *(undefined1 (*) [32])(local_28f0.ray + 0x1c0) = auVar63;
                  auVar63 = vmaskmovps_avx(auVar51,*(undefined1 (*) [32])(local_28f0.hit + 0x60));
                  *(undefined1 (*) [32])(local_28f0.ray + 0x1e0) = auVar63;
                  auVar63 = vmaskmovps_avx(auVar51,*(undefined1 (*) [32])(local_28f0.hit + 0x80));
                  *(undefined1 (*) [32])(local_28f0.ray + 0x200) = auVar63;
                  auVar63 = vpmaskmovd_avx2(auVar51,*(undefined1 (*) [32])(local_28f0.hit + 0xa0));
                  *(undefined1 (*) [32])(local_28f0.ray + 0x220) = auVar63;
                  auVar63 = vpmaskmovd_avx2(auVar51,*(undefined1 (*) [32])(local_28f0.hit + 0xc0));
                  *(undefined1 (*) [32])(local_28f0.ray + 0x240) = auVar63;
                  auVar63 = vpmaskmovd_avx2(auVar51,*(undefined1 (*) [32])(local_28f0.hit + 0xe0));
                  *(undefined1 (*) [32])(local_28f0.ray + 0x260) = auVar63;
                  auVar63 = vpmaskmovd_avx2(auVar51,*(undefined1 (*) [32])(local_28f0.hit + 0x100));
                  *(undefined1 (*) [32])(local_28f0.ray + 0x280) = auVar63;
                }
              }
              if ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar46 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar46 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar46 >> 0x7f,0) == '\0') &&
                    (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar46 >> 0xbf,0) == '\0') &&
                  (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar46[0x1f]) {
                *(undefined4 *)(ray + k * 4 + 0x100) = local_28a0._0_4_;
              }
              else {
                local_28a0 = ZEXT432(*(uint *)(ray + k * 4 + 0x100));
              }
              *(undefined4 *)(local_28c0 + uVar28 * 4) = 0;
              auVar43 = ZEXT3264(local_28a0);
              uVar84 = local_28a0._0_4_;
              auVar42._4_4_ = uVar84;
              auVar42._0_4_ = uVar84;
              auVar42._8_4_ = uVar84;
              auVar42._12_4_ = uVar84;
              auVar42._16_4_ = uVar84;
              auVar42._20_4_ = uVar84;
              auVar42._24_4_ = uVar84;
              auVar42._28_4_ = uVar84;
              auVar64 = ZEXT3264(local_2660);
              auVar63 = vcmpps_avx(local_2660,auVar42,2);
              local_28c0 = vandps_avx(auVar63,local_28c0);
              auVar89 = ZEXT3264(local_2640);
            }
            if ((((((((local_28c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_28c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_28c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_28c0 >> 0x7f,0) == '\0') &&
                  (local_28c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_28c0 >> 0xbf,0) == '\0') &&
                (local_28c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_28c0[0x1f]) break;
            auVar48._8_4_ = 0x7f800000;
            auVar48._0_8_ = 0x7f8000007f800000;
            auVar48._12_4_ = 0x7f800000;
            auVar48._16_4_ = 0x7f800000;
            auVar48._20_4_ = 0x7f800000;
            auVar48._24_4_ = 0x7f800000;
            auVar48._28_4_ = 0x7f800000;
            auVar63 = vblendvps_avx(auVar48,auVar64._0_32_,local_28c0);
            auVar46 = vshufps_avx(auVar63,auVar63,0xb1);
            auVar46 = vminps_avx(auVar63,auVar46);
            auVar51 = vshufpd_avx(auVar46,auVar46,5);
            auVar46 = vminps_avx(auVar46,auVar51);
            auVar51 = vpermpd_avx2(auVar46,0x4e);
            auVar46 = vminps_avx(auVar46,auVar51);
            auVar46 = vcmpps_avx(auVar63,auVar46,0);
            auVar51 = local_28c0 & auVar46;
            auVar63 = local_28c0;
            if ((((((((auVar51 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar51 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar51 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar51 >> 0x7f,0) != '\0') ||
                  (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar51 >> 0xbf,0) != '\0') ||
                (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar51[0x1f] < '\0') {
              auVar63 = vandps_avx(auVar46,local_28c0);
            }
            uVar27 = vmovmskps_avx(auVar63);
            uVar26 = 0;
            for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x80000000) {
              uVar26 = uVar26 + 1;
            }
          } while( true );
        }
      }
      auVar64 = ZEXT3264(local_2500);
      auVar67 = ZEXT3264(local_2520);
      auVar71 = ZEXT3264(local_2560);
      auVar76 = ZEXT3264(local_2580);
      auVar79 = ZEXT3264(local_25a0);
      auVar83 = ZEXT3264(local_25c0);
    }
    uVar84 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar43 = ZEXT3264(CONCAT428(uVar84,CONCAT424(uVar84,CONCAT420(uVar84,CONCAT416(uVar84,CONCAT412
                                                  (uVar84,CONCAT48(uVar84,CONCAT44(uVar84,uVar84))))
                                                  ))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }